

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

Cookie * Curl_cookie_getlist(CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  Cookie *pCVar2;
  _Bool _Var3;
  byte bVar4;
  _Bool _Var5;
  int iVar6;
  time_t tVar7;
  size_t __n;
  Cookie *pCVar8;
  char *pcVar9;
  char *__s;
  char *pcVar10;
  size_t sVar11;
  undefined8 *__base;
  undefined8 *puVar12;
  Cookie *pCVar13;
  size_t sVar14;
  size_t local_58;
  
  tVar7 = time((time_t *)0x0);
  if (c == (CookieInfo *)0x0) {
    return (Cookie *)0x0;
  }
  if (c->cookies != (Cookie *)0x0) {
    remove_expired(c);
    _Var3 = isip(host);
    sVar14 = 1;
    local_58 = 0;
    pCVar13 = (Cookie *)0x0;
LAB_004b8262:
    c = (CookieInfo *)((Cookie *)c)->next;
    if ((Cookie *)c != (Cookie *)0x0) {
      if (((((Cookie *)c)->expires == 0) || (tVar7 < ((Cookie *)c)->expires)) &&
         ((byte)(((Cookie *)c)->secure ^ 1U | secure) == 1)) {
        if (((Cookie *)c)->domain != (char *)0x0) {
          bVar4 = ((Cookie *)c)->tailmatch ^ 1;
          if ((bVar4 & 1) == 0 && !_Var3) {
            _Var5 = tailmatch(((Cookie *)c)->domain,host);
            if (_Var5) goto LAB_004b82df;
            bVar4 = ((Cookie *)c)->tailmatch ^ 1;
          }
          if (((bVar4 & 1) == 0 && !_Var3) ||
             (iVar6 = Curl_strcasecompare(host,((Cookie *)c)->domain), iVar6 == 0))
          goto LAB_004b8262;
        }
LAB_004b82df:
        pcVar9 = ((Cookie *)c)->spath;
        if ((pcVar9 != (char *)0x0) && (__n = strlen(pcVar9), __n != 1)) {
          __s = (*Curl_cstrdup)(path);
          if (__s == (char *)0x0) goto LAB_004b8262;
          pcVar10 = strchr(__s,0x3f);
          if (pcVar10 != (char *)0x0) {
            *pcVar10 = '\0';
          }
          if (*__s != '/') {
            (*Curl_cfree)(__s);
            __s = (*Curl_cstrdup)("/");
            if (__s == (char *)0x0) goto LAB_004b8262;
          }
          sVar11 = strlen(__s);
          if ((sVar11 < __n) || (iVar6 = strncmp(pcVar9,__s,__n), iVar6 != 0)) {
            (*Curl_cfree)(__s);
            goto LAB_004b8262;
          }
          if (__n == sVar11) {
            (*Curl_cfree)(__s);
          }
          else {
            cVar1 = __s[__n];
            (*Curl_cfree)(__s);
            if (cVar1 != '/') goto LAB_004b8262;
          }
        }
        pCVar8 = (Cookie *)(*Curl_ccalloc)(0x60,1);
        if (pCVar8 == (Cookie *)0x0) goto LAB_004b853a;
        if (((Cookie *)c)->expirestr != (char *)0x0) {
          pcVar9 = (*Curl_cstrdup)(((Cookie *)c)->expirestr);
          pCVar8->expirestr = pcVar9;
          if (pcVar9 != (char *)0x0) goto LAB_004b833d;
LAB_004b8532:
          freecookie(pCVar8);
          goto LAB_004b853a;
        }
LAB_004b833d:
        if (((Cookie *)c)->domain != (char *)0x0) {
          pcVar9 = (*Curl_cstrdup)(((Cookie *)c)->domain);
          pCVar8->domain = pcVar9;
          if (pcVar9 == (char *)0x0) goto LAB_004b8532;
        }
        if (((Cookie *)c)->path != (char *)0x0) {
          pcVar9 = (*Curl_cstrdup)(((Cookie *)c)->path);
          pCVar8->path = pcVar9;
          if (pcVar9 == (char *)0x0) goto LAB_004b8532;
        }
        if (((Cookie *)c)->spath != (char *)0x0) {
          pcVar9 = (*Curl_cstrdup)(((Cookie *)c)->spath);
          pCVar8->spath = pcVar9;
          if (pcVar9 == (char *)0x0) goto LAB_004b8532;
        }
        if (((Cookie *)c)->name != (char *)0x0) {
          pcVar9 = (*Curl_cstrdup)(((Cookie *)c)->name);
          pCVar8->name = pcVar9;
          if (pcVar9 == (char *)0x0) goto LAB_004b8532;
        }
        if (((Cookie *)c)->value != (char *)0x0) {
          pcVar9 = (*Curl_cstrdup)(((Cookie *)c)->value);
          pCVar8->value = pcVar9;
          if (pcVar9 == (char *)0x0) goto LAB_004b8532;
        }
        if (((Cookie *)c)->maxage != (char *)0x0) {
          pcVar9 = (*Curl_cstrdup)(((Cookie *)c)->maxage);
          pCVar8->maxage = pcVar9;
          if (pcVar9 == (char *)0x0) goto LAB_004b8532;
        }
        if (((Cookie *)c)->version != (char *)0x0) {
          pcVar9 = (*Curl_cstrdup)(((Cookie *)c)->version);
          pCVar8->version = pcVar9;
          if (pcVar9 == (char *)0x0) goto LAB_004b8532;
        }
        pCVar8->expires = ((Cookie *)c)->expires;
        pCVar8->tailmatch = ((Cookie *)c)->tailmatch;
        pCVar8->secure = ((Cookie *)c)->secure;
        pCVar8->livecookie = ((Cookie *)c)->livecookie;
        pCVar8->httponly = ((Cookie *)c)->httponly;
        pCVar8->next = pCVar13;
        local_58 = local_58 + 1;
        pCVar13 = pCVar8;
      }
      goto LAB_004b8262;
    }
    if (local_58 == 0) {
      return pCVar13;
    }
    __base = (undefined8 *)(*Curl_cmalloc)(local_58 * 8);
    puVar12 = __base;
    if (__base != (undefined8 *)0x0) {
      for (; pCVar13 != (Cookie *)0x0; pCVar13 = pCVar13->next) {
        *puVar12 = pCVar13;
        puVar12 = puVar12 + 1;
      }
      qsort(__base,local_58,8,cookie_sort);
      pCVar13 = (Cookie *)*__base;
      pCVar8 = pCVar13;
      for (; local_58 != sVar14; sVar14 = sVar14 + 1) {
        pCVar2 = (Cookie *)__base[sVar14];
        pCVar8->next = pCVar2;
        pCVar8 = pCVar2;
      }
      *(undefined8 *)__base[local_58 - 1] = 0;
      (*Curl_cfree)(__base);
      return pCVar13;
    }
LAB_004b853a:
    Curl_cookie_freelist(pCVar13);
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  time_t now = time(NULL);
  struct Cookie *mainco=NULL;
  size_t matches = 0;
  bool is_ip;

  if(!c || !c->cookies)
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = isip(host);

  co = c->cookies;

  while(co) {
    /* only process this cookie if it is not expired or had no expire
       date AND that if the cookie requires we're secure we must only
       continue if we are! */
    if((!co->expires || (co->expires > now)) &&
       (co->secure?secure:TRUE)) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /* the right part of the host matches the domain stuff in the
           cookie data */

        /* now check the left part of the path with the cookies path
           requirement */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /* and now, we know this is a match and we should create an
             entry for the return-linked-list */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
          }
          else {
            fail:
            /* failure, clear up the allocated chain and return NULL */
            Curl_cookie_freelist(mainco);
            return NULL;
          }
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /* Now we need to make sure that if there is a name appearing more than
       once, the longest specified path version comes first. To make this
       the swiftest way, we just sort them all based on path length. */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i=0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i=0; i<matches-1; i++)
      array[i]->next = array[i+1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */
}